

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O3

void doREPL(lua_State *L)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t size;
  char *pcVar4;
  size_t len;
  size_t local_48;
  char *local_40;
  ulong local_38;
  
  local_40 = progname;
  progname = (char *)0x0;
  lua_settop(L,0);
  iVar1 = pushline(L,1);
  if (iVar1 != 0) {
    do {
      pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
      pcVar3 = lua_pushfstring(L,"return %s;",pcVar3);
      size = strlen(pcVar3);
      iVar1 = luaL_loadbufferx(L,pcVar3,size,"=stdin",(char *)0x0);
      if (iVar1 == 0) {
        lua_rotate(L,-2,-1);
        lua_settop(L,-2);
        iVar1 = 0;
      }
      else {
        lua_settop(L,-3);
        while( true ) {
          pcVar3 = lua_tolstring(L,1,&local_48);
          iVar1 = luaL_loadbufferx(L,pcVar3,local_48,"=stdin",(char *)0x0);
          if (iVar1 != 3) break;
          pcVar3 = lua_tolstring(L,-1,&local_38);
          if ((local_38 < 5) || (iVar1 = strcmp(pcVar3 + (local_38 - 5),"<eof>"), iVar1 != 0)) {
LAB_001092f4:
            iVar1 = 3;
            break;
          }
          lua_settop(L,-2);
          iVar1 = pushline(L,0);
          if (iVar1 == 0) goto LAB_001092f4;
          lua_pushstring(L,anon_var_dwarf_11e77 + 5);
          lua_rotate(L,-2,1);
          lua_concat(L,3);
        }
      }
      lua_rotate(L,1,-1);
      lua_settop(L,-2);
      iVar2 = lua_gettop(L);
      if (iVar2 != 1) {
        __assert_fail("lua_gettop(L) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lua.c"
                      ,0x182,"int loadline(lua_State *)");
      }
      if (iVar1 == 0) {
        iVar1 = docall(L,0,-1);
        if (iVar1 != 0) goto LAB_00109350;
        iVar1 = lua_gettop(L);
        if (0 < iVar1) {
          luaL_checkstack(L,0x14,"too many results to print");
          lua_getglobal(L,"print");
          lua_rotate(L,1,1);
          iVar1 = lua_pcallk(L,iVar1,0,0,0,(lua_KFunction)0x0);
          pcVar3 = progname;
          if (iVar1 != 0) {
            pcVar4 = lua_tolstring(L,-1,(size_t *)0x0);
            pcVar4 = lua_pushfstring(L,"error calling \'print\' (%s)",pcVar4);
            l_message(L,pcVar3,pcVar4);
          }
        }
      }
      else {
        if (iVar1 == -1) break;
LAB_00109350:
        report(L,iVar1);
      }
      lua_settop(L,0);
      iVar1 = pushline(L,1);
    } while (iVar1 != 0);
  }
  lua_settop(L,0);
  ravi_writeline(L);
  progname = local_40;
  return;
}

Assistant:

static void doREPL (lua_State *L) {
  int status;
  const char *oldprogname = progname;
  progname = NULL;  /* no 'progname' on errors in interactive mode */
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK)
      status = docall(L, 0, LUA_MULTRET);
    if (status == LUA_OK) l_print(L);
    else report(L, status);
  }
  lua_settop(L, 0);  /* clear stack */
  lua_writeline();
  progname = oldprogname;
}